

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

void mon_animal_list(boolean construct)

{
  int local_2d0;
  int local_2cc;
  int n;
  int i;
  short animal_temp [344];
  boolean construct_local;
  
  if (construct == '\0') {
    if (animal_list != (short *)0x0) {
      free(animal_list);
      animal_list = (short *)0x0;
    }
    animal_list_count = 0;
  }
  else {
    local_2d0 = 0;
    for (local_2cc = 0; local_2cc < 0x158; local_2cc = local_2cc + 1) {
      if ((mons[local_2cc].mflags1 & 0x40000) != 0) {
        *(short *)((long)&n + (long)local_2d0 * 2) = (short)local_2cc;
        local_2d0 = local_2d0 + 1;
      }
    }
    animal_list = (short *)malloc((long)local_2d0 << 1);
    memcpy(animal_list,&n,(long)local_2d0 << 1);
    animal_list_count = local_2d0;
  }
  return;
}

Assistant:

void mon_animal_list(boolean construct)
{
	if (construct) {
	    short animal_temp[SPECIAL_PM];
	    int i, n;

	 /* if (animal_list) impossible("animal_list already exists"); */

	    for (n = 0, i = LOW_PM; i < SPECIAL_PM; i++)
		if (is_animal(&mons[i])) animal_temp[n++] = i;
	 /* if (n == 0) animal_temp[n++] = NON_PM; */

	    animal_list = malloc(n * sizeof *animal_list);
	    memcpy(animal_list,
			  animal_temp,
			  n * sizeof *animal_list);
	    animal_list_count = n;
	} else {	/* release */
	    if (animal_list) free(animal_list), animal_list = 0;
	    animal_list_count = 0;
	}
}